

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_shutdown(LIBSSH2_SFTP *sftp)

{
  LIBSSH2_SESSION *pLVar1;
  int iVar2;
  LIBSSH2_SESSION *session;
  int rc;
  LIBSSH2_SFTP *sftp_local;
  
  pLVar1 = sftp->channel->session;
  if (sftp->partial_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->partial_packet,&pLVar1->abstract);
    sftp->partial_packet = (uchar *)0x0;
  }
  if (sftp->open_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->open_packet,&pLVar1->abstract);
    sftp->open_packet = (uchar *)0x0;
  }
  if (sftp->readdir_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->readdir_packet,&pLVar1->abstract);
    sftp->readdir_packet = (uchar *)0x0;
  }
  if (sftp->fstat_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->fstat_packet,&pLVar1->abstract);
    sftp->fstat_packet = (uchar *)0x0;
  }
  if (sftp->unlink_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->unlink_packet,&pLVar1->abstract);
    sftp->unlink_packet = (uchar *)0x0;
  }
  if (sftp->rename_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->rename_packet,&pLVar1->abstract);
    sftp->rename_packet = (uchar *)0x0;
  }
  if (sftp->fstatvfs_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->fstatvfs_packet,&pLVar1->abstract);
    sftp->fstatvfs_packet = (uchar *)0x0;
  }
  if (sftp->statvfs_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->statvfs_packet,&pLVar1->abstract);
    sftp->statvfs_packet = (uchar *)0x0;
  }
  if (sftp->mkdir_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->mkdir_packet,&pLVar1->abstract);
    sftp->mkdir_packet = (uchar *)0x0;
  }
  if (sftp->rmdir_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->rmdir_packet,&pLVar1->abstract);
    sftp->rmdir_packet = (uchar *)0x0;
  }
  if (sftp->stat_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->stat_packet,&pLVar1->abstract);
    sftp->stat_packet = (uchar *)0x0;
  }
  if (sftp->symlink_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->symlink_packet,&pLVar1->abstract);
    sftp->symlink_packet = (uchar *)0x0;
  }
  if (sftp->fsync_packet != (uchar *)0x0) {
    (*pLVar1->free)(sftp->fsync_packet,&pLVar1->abstract);
    sftp->fsync_packet = (uchar *)0x0;
  }
  sftp_packet_flush(sftp);
  iVar2 = _libssh2_channel_free(sftp->channel);
  return iVar2;
}

Assistant:

static int
sftp_shutdown(LIBSSH2_SFTP *sftp)
{
    int rc;
    LIBSSH2_SESSION *session = sftp->channel->session;
    /*
     * Make sure all memory used in the state variables are free
     */
    if(sftp->partial_packet) {
        LIBSSH2_FREE(session, sftp->partial_packet);
        sftp->partial_packet = NULL;
    }
    if(sftp->open_packet) {
        LIBSSH2_FREE(session, sftp->open_packet);
        sftp->open_packet = NULL;
    }
    if(sftp->readdir_packet) {
        LIBSSH2_FREE(session, sftp->readdir_packet);
        sftp->readdir_packet = NULL;
    }
    if(sftp->fstat_packet) {
        LIBSSH2_FREE(session, sftp->fstat_packet);
        sftp->fstat_packet = NULL;
    }
    if(sftp->unlink_packet) {
        LIBSSH2_FREE(session, sftp->unlink_packet);
        sftp->unlink_packet = NULL;
    }
    if(sftp->rename_packet) {
        LIBSSH2_FREE(session, sftp->rename_packet);
        sftp->rename_packet = NULL;
    }
    if(sftp->fstatvfs_packet) {
        LIBSSH2_FREE(session, sftp->fstatvfs_packet);
        sftp->fstatvfs_packet = NULL;
    }
    if(sftp->statvfs_packet) {
        LIBSSH2_FREE(session, sftp->statvfs_packet);
        sftp->statvfs_packet = NULL;
    }
    if(sftp->mkdir_packet) {
        LIBSSH2_FREE(session, sftp->mkdir_packet);
        sftp->mkdir_packet = NULL;
    }
    if(sftp->rmdir_packet) {
        LIBSSH2_FREE(session, sftp->rmdir_packet);
        sftp->rmdir_packet = NULL;
    }
    if(sftp->stat_packet) {
        LIBSSH2_FREE(session, sftp->stat_packet);
        sftp->stat_packet = NULL;
    }
    if(sftp->symlink_packet) {
        LIBSSH2_FREE(session, sftp->symlink_packet);
        sftp->symlink_packet = NULL;
    }
    if(sftp->fsync_packet) {
        LIBSSH2_FREE(session, sftp->fsync_packet);
        sftp->fsync_packet = NULL;
    }

    sftp_packet_flush(sftp);

    /* TODO: We should consider walking over the sftp_handles list and kill
     * any remaining sftp handles ... */

    rc = _libssh2_channel_free(sftp->channel);

    return rc;
}